

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O2

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,binary *values)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::
  make_shared<msgpack11::MsgPackBinary,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_18);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_ptr).super___shared_ptr<msgpack11::MsgPackValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_18;
  (this->m_ptr).super___shared_ptr<msgpack11::MsgPackValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  local_18 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  return;
}

Assistant:

MsgPack::MsgPack(MsgPack::binary &&values)         : m_ptr(make_shared<MsgPackBinary>(move(values))) {}